

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  char cVar1;
  _Bool _Var2;
  int iVar3;
  Curl_handler *pCVar4;
  CURLU *pCVar5;
  size_t sVar6;
  char *pcVar7;
  bool bVar8;
  size_t local_d8;
  char *p_1;
  size_t newplen;
  _Bool addamperand;
  size_t querylen;
  char *p;
  char *enc;
  char *pcStack_80;
  _Bool free_part;
  char *o;
  char *i;
  size_t nalloc;
  char *newp;
  CURLU *handle2;
  char *redired_url;
  char *oldurl;
  CURLUcode result;
  _Bool appendquery;
  _Bool urlskipslash;
  _Bool plusencode;
  _Bool urlencode;
  long port;
  char **storep;
  char *pcStack_28;
  uint flags_local;
  char *part_local;
  CURLU *pCStack_18;
  CURLUPart what_local;
  CURLU *u_local;
  
  port = 0;
  _result = 0;
  oldurl._7_1_ = (flags & 0x80) != 0;
  oldurl._6_1_ = 0;
  oldurl._5_1_ = 0;
  oldurl._4_1_ = 0;
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  storep._4_4_ = flags;
  pcStack_28 = part;
  part_local._4_4_ = what;
  pCStack_18 = u;
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      port = (long)u;
      break;
    case CURLUPART_USER:
      port = (long)&u->user;
      break;
    case CURLUPART_PASSWORD:
      port = (long)&u->password;
      break;
    case CURLUPART_OPTIONS:
      port = (long)&u->options;
      break;
    case CURLUPART_HOST:
      port = (long)&u->host;
      break;
    case CURLUPART_PORT:
      port = (long)&u->port;
      break;
    case CURLUPART_PATH:
      port = (long)&u->path;
      break;
    case CURLUPART_QUERY:
      port = (long)&u->query;
      break;
    case CURLUPART_FRAGMENT:
      port = (long)&u->fragment;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if ((port != 0) && (*(long *)port != 0)) {
      (*Curl_cfree)(*(void **)port);
      *(undefined8 *)port = 0;
    }
    return CURLUE_OK;
  }
  switch(what) {
  case CURLUPART_URL:
    _Var2 = Curl_is_absolute_url(part,(char *)0x0,8);
    if (_Var2) {
      pCVar5 = curl_url();
      if (pCVar5 == (CURLU *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      oldurl._0_4_ = parseurl(pcStack_28,pCVar5,storep._4_4_);
      if ((CURLUcode)oldurl == CURLUE_OK) {
        mv_urlhandle(pCVar5,pCStack_18);
      }
      else {
        curl_url_cleanup(pCVar5);
      }
      return (CURLUcode)oldurl;
    }
    oldurl._0_4_ = curl_url_get(pCStack_18,CURLUPART_URL,&redired_url,storep._4_4_);
    if ((CURLUcode)oldurl != CURLUE_OK) {
      pCVar5 = curl_url();
      if (pCVar5 == (CURLU *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      oldurl._0_4_ = parseurl(pcStack_28,pCVar5,storep._4_4_);
      if ((CURLUcode)oldurl == CURLUE_OK) {
        mv_urlhandle(pCVar5,pCStack_18);
      }
      else {
        curl_url_cleanup(pCVar5);
      }
      return (CURLUcode)oldurl;
    }
    pcVar7 = Curl_concat_url(redired_url,pcStack_28);
    (*Curl_cfree)(redired_url);
    if (pcVar7 == (char *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    pCVar5 = curl_url();
    if (pCVar5 == (CURLU *)0x0) {
      (*Curl_cfree)(pcVar7);
      return CURLUE_OUT_OF_MEMORY;
    }
    oldurl._0_4_ = parseurl(pcVar7,pCVar5,storep._4_4_);
    (*Curl_cfree)(pcVar7);
    if ((CURLUcode)oldurl == CURLUE_OK) {
      mv_urlhandle(pCVar5,pCStack_18);
    }
    else {
      curl_url_cleanup(pCVar5);
    }
    return (CURLUcode)oldurl;
  case CURLUPART_SCHEME:
    if (((flags & 8) == 0) && (pCVar4 = Curl_builtin_scheme(part), pCVar4 == (Curl_handler *)0x0)) {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    port = (long)pCStack_18;
    oldurl._7_1_ = 0;
    break;
  case CURLUPART_USER:
    port = (long)&u->user;
    break;
  case CURLUPART_PASSWORD:
    port = (long)&u->password;
    break;
  case CURLUPART_OPTIONS:
    port = (long)&u->options;
    break;
  case CURLUPART_HOST:
    port = (long)&u->host;
    break;
  case CURLUPART_PORT:
    oldurl._7_1_ = 0;
    _result = strtol(part,(char **)0x0,10);
    if ((_result < 1) || (0xffff < _result)) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    port = (long)&pCStack_18->port;
    break;
  case CURLUPART_PATH:
    oldurl._5_1_ = 1;
    port = (long)&u->path;
    break;
  case CURLUPART_QUERY:
    oldurl._4_1_ = (flags & 0x100) != 0;
    port = (long)&u->query;
    oldurl._6_1_ = oldurl._7_1_;
    break;
  case CURLUPART_FRAGMENT:
    port = (long)&u->fragment;
    break;
  default:
    return CURLUE_UNKNOWN_PART;
  }
  if (port != 0) {
    sVar6 = strlen(pcStack_28);
    if ((oldurl._7_1_ & 1) == 0) {
      nalloc = (size_t)(*Curl_cstrdup)(pcStack_28);
      querylen = nalloc;
      if ((char *)nalloc == (char *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      while (*(char *)querylen != '\0') {
        if ((((*(char *)querylen == '%') &&
             (iVar3 = Curl_isxdigit((uint)*(byte *)(querylen + 1)), iVar3 != 0)) &&
            (iVar3 = Curl_isxdigit((uint)*(byte *)(querylen + 2)), iVar3 != 0)) &&
           ((iVar3 = Curl_isupper((uint)*(byte *)(querylen + 1)), iVar3 != 0 ||
            (iVar3 = Curl_isupper((uint)*(byte *)(querylen + 2)), iVar3 != 0)))) {
          iVar3 = tolower((uint)*(byte *)(querylen + 1));
          *(char *)(querylen + 1) = (char)iVar3;
          iVar3 = tolower((uint)*(byte *)(querylen + 2));
          *(char *)(querylen + 2) = (char)iVar3;
          querylen = querylen + 3;
        }
        else {
          querylen = querylen + 1;
        }
      }
    }
    else {
      bVar8 = false;
      nalloc = (size_t)(*Curl_cmalloc)(sVar6 * 3 + 1);
      if ((char *)nalloc == (char *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      if ((oldurl._6_1_ & 1) != 0) {
        pcStack_80 = (char *)nalloc;
        for (o = pcStack_28; *o != '\0'; o = o + 1) {
          if (*o == ' ') {
            cVar1 = '+';
          }
          else {
            cVar1 = *o;
          }
          *pcStack_80 = cVar1;
          pcStack_80 = pcStack_80 + 1;
        }
        *pcStack_80 = '\0';
        pcStack_28 = (*Curl_cstrdup)((char *)nalloc);
        if (pcStack_28 == (char *)0x0) {
          (*Curl_cfree)((void *)nalloc);
          return CURLUE_OUT_OF_MEMORY;
        }
        bVar8 = true;
      }
      pcStack_80 = (char *)nalloc;
      for (o = pcStack_28; *o != '\0'; o = o + 1) {
        _Var2 = Curl_isunreserved(*o);
        if ((((_Var2) || ((*o == '/' && ((oldurl._5_1_ & 1) != 0)))) ||
            ((*o == '=' && ((oldurl._4_1_ & 1) != 0)))) ||
           ((*o == '+' && ((oldurl._6_1_ & 1) != 0)))) {
          *pcStack_80 = *o;
          pcStack_80 = pcStack_80 + 1;
        }
        else {
          curl_msnprintf(pcStack_80,4,"%%%02x",(ulong)(uint)(int)*o);
          pcStack_80 = pcStack_80 + 3;
        }
      }
      *pcStack_80 = '\0';
      if (bVar8) {
        (*Curl_cfree)(pcStack_28);
      }
    }
    if ((oldurl._4_1_ & 1) != 0) {
      if (pCStack_18->query == (char *)0x0) {
        local_d8 = 0;
      }
      else {
        local_d8 = strlen(pCStack_18->query);
      }
      if (local_d8 != 0) {
        bVar8 = pCStack_18->query[local_d8 - 1] != '&';
        sVar6 = strlen((char *)nalloc);
        pcVar7 = (char *)(*Curl_cmalloc)(local_d8 + bVar8 + sVar6 + 1);
        if (pcVar7 == (char *)0x0) {
          (*Curl_cfree)((void *)nalloc);
          return CURLUE_OUT_OF_MEMORY;
        }
        strcpy(pcVar7,pCStack_18->query);
        if (bVar8) {
          pcVar7[local_d8] = '&';
        }
        strcpy(pcVar7 + local_d8 + bVar8,(char *)nalloc);
        (*Curl_cfree)((void *)nalloc);
        (*Curl_cfree)(*(void **)port);
        *(char **)port = pcVar7;
        return CURLUE_OK;
      }
    }
    (*Curl_cfree)(*(void **)port);
    *(size_t *)port = nalloc;
  }
  if (_result != 0) {
    pCStack_18->portnum = _result;
  }
  return CURLUE_OK;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  long port = 0;
  bool urlencode = (flags & CURLU_URLENCODE)? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool appendquery = FALSE;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_PORT:
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      free(*storep);
      *storep = NULL;
    }
    return CURLUE_OK;
  }

  switch(what) {
  case CURLUPART_SCHEME:
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) &&
       /* verify that it is a fine scheme */
       !Curl_builtin_scheme(part))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    break;
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST:
    storep = &u->host;
    break;
  case CURLUPART_PORT:
    urlencode = FALSE; /* never */
    port = strtol(part, NULL, 10);  /* Port number must be decimal */
    if((port <= 0) || (port > 0xffff))
      return CURLUE_BAD_PORT_NUMBER;
    storep = &u->port;
    break;
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY)?1:0;
    storep = &u->query;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLUcode result;
    char *oldurl;
    char *redired_url;
    CURLU *handle2;

    if(Curl_is_absolute_url(part, NULL, MAX_SCHEME_LEN)) {
      handle2 = curl_url();
      if(!handle2)
        return CURLUE_OUT_OF_MEMORY;
      result = parseurl(part, handle2, flags);
      if(!result)
        mv_urlhandle(handle2, u);
      else
        curl_url_cleanup(handle2);
      return result;
    }
    /* extract the full "old" URL to do the redirect on */
    result = curl_url_get(u, CURLUPART_URL, &oldurl, flags);
    if(result) {
      /* couldn't get the old URL, just use the new! */
      handle2 = curl_url();
      if(!handle2)
        return CURLUE_OUT_OF_MEMORY;
      result = parseurl(part, handle2, flags);
      if(!result)
        mv_urlhandle(handle2, u);
      else
        curl_url_cleanup(handle2);
      return result;
    }

    /* apply the relative part to create a new URL */
    redired_url = Curl_concat_url(oldurl, part);
    free(oldurl);
    if(!redired_url)
      return CURLUE_OUT_OF_MEMORY;

    /* now parse the new URL */
    handle2 = curl_url();
    if(!handle2) {
      free(redired_url);
      return CURLUE_OUT_OF_MEMORY;
    }
    result = parseurl(redired_url, handle2, flags);
    free(redired_url);
    if(!result)
      mv_urlhandle(handle2, u);
    else
      curl_url_cleanup(handle2);
    return result;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  if(storep) {
    const char *newp = part;
    size_t nalloc = strlen(part);

    if(urlencode) {
      const char *i;
      char *o;
      bool free_part = FALSE;
      char *enc = malloc(nalloc * 3 + 1); /* for worst case! */
      if(!enc)
        return CURLUE_OUT_OF_MEMORY;
      if(plusencode) {
        /* space to plus */
        i = part;
        for(o = enc; *i; ++o, ++i)
          *o = (*i == ' ') ? '+' : *i;
        *o = 0; /* zero terminate */
        part = strdup(enc);
        if(!part) {
          free(enc);
          return CURLUE_OUT_OF_MEMORY;
        }
        free_part = TRUE;
      }
      for(i = part, o = enc; *i; i++) {
        if(Curl_isunreserved(*i) ||
           ((*i == '/') && urlskipslash) ||
           ((*i == '=') && appendquery) ||
           ((*i == '+') && plusencode)) {
          *o = *i;
          o++;
        }
        else {
          snprintf(o, 4, "%%%02x", *i);
          o += 3;
        }
      }
      *o = 0; /* zero terminate */
      newp = enc;
      if(free_part)
        free((char *)part);
    }
    else {
      char *p;
      newp = strdup(part);
      if(!newp)
        return CURLUE_OUT_OF_MEMORY;
      p = (char *)newp;
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = (char)TOLOWER(p[1]);
          p[2] = (char)TOLOWER(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }

    if(appendquery) {
      /* Append the string onto the old query. Add a '&' separator if none is
         present at the end of the exsting query already */
      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        size_t newplen = strlen(newp);
        char *p = malloc(querylen + addamperand + newplen + 1);
        if(!p) {
          free((char *)newp);
          return CURLUE_OUT_OF_MEMORY;
        }
        strcpy(p, u->query); /* original query */
        if(addamperand)
          p[querylen] = '&'; /* ampersand */
        strcpy(&p[querylen + addamperand], newp); /* new suffix */
        free((char *)newp);
        free(*storep);
        *storep = p;
        return CURLUE_OK;
      }
    }

    free(*storep);
    *storep = (char *)newp;
  }
  /* set after the string, to make it not assigned if the allocation above
     fails */
  if(port)
    u->portnum = port;
  return CURLUE_OK;
}